

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O2

int yy_suffix(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *cclass;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *cclass_00;
  int yypos46;
  code *pcVar6;
  char *pcVar7;
  int yythunkpos57;
  int yypos0;
  int yythunkpos0_7;
  int yythunkpos46;
  
  iVar5 = G->pos;
  iVar4 = G->thunkpos;
  iVar2 = yy_identifier(G);
  if (iVar2 == 0) {
LAB_00103474:
    G->pos = iVar5;
    G->thunkpos = iVar4;
    iVar2 = yy_identifier(G);
    if (iVar2 != 0) {
      iVar2 = G->pos;
      iVar1 = G->thunkpos;
      iVar3 = yy_EQUAL(G);
      if (iVar3 == 0) {
        G->pos = iVar2;
        G->thunkpos = iVar1;
        iVar5 = G->begin;
        iVar4 = G->end;
        pcVar6 = yy_3_primary;
        pcVar7 = "yy_3_primary";
        goto LAB_00103820;
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar4;
    iVar2 = yymatchChar(G,0x28);
    pcVar7 = extraout_RDX;
    if (iVar2 == 0) {
LAB_001034e6:
      G->pos = iVar5;
      G->thunkpos = iVar4;
      iVar2 = yymatchClass(G,(uchar *)"",pcVar7);
      pcVar7 = extraout_RDX_02;
      if (iVar2 == 0) {
LAB_00103577:
        G->pos = iVar5;
        G->thunkpos = iVar4;
        iVar2 = yymatchClass(G,(uchar *)"",pcVar7);
        if (iVar2 != 0) {
          yyText(G,G->begin,G->end);
          G->begin = G->pos;
          pcVar7 = extraout_RDX_06;
          do {
            iVar2 = G->pos;
            iVar1 = G->thunkpos;
            iVar3 = yymatchClass(G,(uchar *)"",pcVar7);
            if (iVar3 != 0) break;
            G->pos = iVar2;
            G->thunkpos = iVar1;
            iVar3 = yy_char(G);
            pcVar7 = extraout_RDX_07;
          } while (iVar3 != 0);
          G->pos = iVar2;
          G->thunkpos = iVar1;
          yyText(G,G->begin,G->end);
          G->end = G->pos;
          iVar2 = yymatchClass(G,(uchar *)"",cclass_00);
          if (iVar2 != 0) goto LAB_00103608;
        }
        G->pos = iVar5;
        G->thunkpos = iVar4;
        iVar2 = yymatchChar(G,0x5b);
        if (iVar2 != 0) {
          yyText(G,G->begin,G->end);
          iVar2 = G->pos;
          G->begin = iVar2;
          while( true ) {
            iVar1 = G->thunkpos;
            iVar3 = yymatchChar(G,0x5d);
            if (iVar3 != 0) break;
            G->pos = iVar2;
            G->thunkpos = iVar1;
            iVar3 = yy_char(G);
            if (((iVar3 == 0) || (iVar3 = yymatchChar(G,0x2d), iVar3 == 0)) ||
               (iVar3 = yy_char(G), iVar3 == 0)) {
              G->pos = iVar2;
              G->thunkpos = iVar1;
              iVar3 = yy_char(G);
              if (iVar3 == 0) break;
            }
            iVar2 = G->pos;
          }
          G->pos = iVar2;
          G->thunkpos = iVar1;
          yyText(G,G->begin,G->end);
          G->end = G->pos;
          iVar2 = yymatchChar(G,0x5d);
          if (iVar2 != 0) {
            yy__(G);
            iVar5 = G->begin;
            iVar4 = G->end;
            pcVar6 = yy_5_primary;
            pcVar7 = "yy_5_primary";
            goto LAB_00103820;
          }
        }
        G->pos = iVar5;
        G->thunkpos = iVar4;
        iVar2 = yymatchChar(G,0x2e);
        if (iVar2 == 0) {
          G->pos = iVar5;
          G->thunkpos = iVar4;
          iVar2 = yy_action(G);
          if (iVar2 == 0) {
            G->pos = iVar5;
            G->thunkpos = iVar4;
            iVar2 = yymatchChar(G,0x3c);
            if (iVar2 == 0) {
              G->pos = iVar5;
              G->thunkpos = iVar4;
              iVar2 = yymatchChar(G,0x3e);
              if (iVar2 == 0) {
                G->pos = iVar5;
                G->thunkpos = iVar4;
                return 0;
              }
              yy__(G);
              iVar5 = G->begin;
              iVar4 = G->end;
              pcVar6 = yy_9_primary;
              pcVar7 = "yy_9_primary";
            }
            else {
              yy__(G);
              iVar5 = G->begin;
              iVar4 = G->end;
              pcVar6 = yy_8_primary;
              pcVar7 = "yy_8_primary";
            }
          }
          else {
            iVar5 = G->begin;
            iVar4 = G->end;
            pcVar6 = yy_7_primary;
            pcVar7 = "yy_7_primary";
          }
        }
        else {
          yy__(G);
          iVar5 = G->begin;
          iVar4 = G->end;
          pcVar6 = yy_6_primary;
          pcVar7 = "yy_6_primary";
        }
      }
      else {
        yyText(G,G->begin,G->end);
        G->begin = G->pos;
        pcVar7 = extraout_RDX_03;
        do {
          iVar2 = G->pos;
          iVar1 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)"",pcVar7);
          if (iVar3 != 0) break;
          G->pos = iVar2;
          G->thunkpos = iVar1;
          iVar3 = yy_char(G);
          pcVar7 = extraout_RDX_04;
        } while (iVar3 != 0);
        G->pos = iVar2;
        G->thunkpos = iVar1;
        yyText(G,G->begin,G->end);
        G->end = G->pos;
        iVar2 = yymatchClass(G,(uchar *)"",cclass);
        pcVar7 = extraout_RDX_05;
        if (iVar2 == 0) goto LAB_00103577;
LAB_00103608:
        yy__(G);
        iVar5 = G->begin;
        iVar4 = G->end;
        pcVar6 = yy_4_primary;
        pcVar7 = "yy_4_primary";
      }
      goto LAB_00103820;
    }
    yy__(G);
    iVar2 = yy_expression(G);
    pcVar7 = extraout_RDX_00;
    if ((iVar2 == 0) || (iVar2 = yymatchChar(G,0x29), pcVar7 = extraout_RDX_01, iVar2 == 0))
    goto LAB_001034e6;
    yy__(G);
  }
  else {
    yyDo(G,yy_1_primary,G->begin,G->end,"yy_1_primary");
    iVar2 = yymatchChar(G,0x3a);
    if (iVar2 == 0) goto LAB_00103474;
    yy__(G);
    iVar2 = yy_identifier(G);
    if (iVar2 == 0) goto LAB_00103474;
    iVar2 = G->pos;
    iVar1 = G->thunkpos;
    iVar3 = yy_EQUAL(G);
    if (iVar3 != 0) goto LAB_00103474;
    G->pos = iVar2;
    G->thunkpos = iVar1;
    iVar5 = G->begin;
    iVar4 = G->end;
    pcVar6 = yy_2_primary;
    pcVar7 = "yy_2_primary";
LAB_00103820:
    yyDo(G,pcVar6,iVar5,iVar4,pcVar7);
  }
  iVar5 = G->pos;
  iVar4 = G->thunkpos;
  iVar2 = yymatchString(G,"~{");
  if (iVar2 != 0) {
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    do {
      iVar2 = G->pos;
      iVar1 = G->thunkpos;
      iVar3 = yy_braces(G);
    } while (iVar3 != 0);
    G->pos = iVar2;
    G->thunkpos = iVar1;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    iVar2 = yymatchChar(G,0x7d);
    if (iVar2 != 0) {
      yy__(G);
      yyDo(G,yy_10_primary,G->begin,G->end,"yy_10_primary");
      iVar5 = G->pos;
      iVar4 = G->thunkpos;
      goto LAB_001038cd;
    }
  }
  G->pos = iVar5;
  G->thunkpos = iVar4;
LAB_001038cd:
  iVar2 = yymatchChar(G,0x3f);
  if (iVar2 == 0) {
    G->pos = iVar5;
    G->thunkpos = iVar4;
    iVar2 = yymatchChar(G,0x2a);
    if (iVar2 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar4;
      iVar2 = yymatchChar(G,0x2b);
      if (iVar2 == 0) {
        G->pos = iVar5;
        G->thunkpos = iVar4;
        return 1;
      }
      yy__(G);
      iVar5 = G->begin;
      iVar4 = G->end;
      pcVar6 = yy_3_suffix;
      pcVar7 = "yy_3_suffix";
    }
    else {
      yy__(G);
      iVar5 = G->begin;
      iVar4 = G->end;
      pcVar6 = yy_2_suffix;
      pcVar7 = "yy_2_suffix";
    }
  }
  else {
    yy__(G);
    iVar5 = G->begin;
    iVar4 = G->end;
    pcVar6 = yy_1_suffix;
    pcVar7 = "yy_1_suffix";
  }
  yyDo(G,pcVar6,iVar5,iVar4,pcVar7);
  return 1;
}

Assistant:

YY_RULE(int) yy_suffix(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "suffix"));
  if (!yy_primary(G))  goto l71;

  {  int yypos72= G->pos, yythunkpos72= G->thunkpos;
  {  int yypos74= G->pos, yythunkpos74= G->thunkpos;  if (!yy_QUESTION(G))  goto l75;
  yyDo(G, yy_1_suffix, G->begin, G->end, "yy_1_suffix");
  goto l74;
  l75:;	  G->pos= yypos74; G->thunkpos= yythunkpos74;  if (!yy_STAR(G))  goto l76;
  yyDo(G, yy_2_suffix, G->begin, G->end, "yy_2_suffix");
  goto l74;
  l76:;	  G->pos= yypos74; G->thunkpos= yythunkpos74;  if (!yy_PLUS(G))  goto l72;
  yyDo(G, yy_3_suffix, G->begin, G->end, "yy_3_suffix");

  }
  l74:;	  goto l73;
  l72:;	  G->pos= yypos72; G->thunkpos= yythunkpos72;
  }
  l73:;	  yyprintf((stderr, "  ok   suffix"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l71:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "suffix"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}